

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_string.c
# Opt level: O3

int mpt_output_bind_string(mpt_output *out,char *descr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  char *pcVar6;
  mpt_msgtype mt;
  mpt_strdest str;
  ushort local_4a;
  undefined4 local_48;
  undefined2 local_44;
  byte local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  char local_3d;
  ulong local_38;
  
  iVar3 = -1;
  if (out != (mpt_output *)0x0) {
    local_44 = 1;
    local_48 = 0x1010700;
    local_40 = 3;
    local_4a = 0x300c;
    if (descr != (char *)0x0) {
      local_38 = 1;
LAB_0010853b:
      local_40 = 3;
      uVar2 = mpt_string_dest(&local_40,0x3a,descr);
      pcVar6 = descr;
      if (uVar2 != 0) {
        do {
          if ((int)uVar2 < 0) {
            mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","bad data destination",
                           (local_48 & 0xff) + 1,pcVar6);
            return (int)local_38 + -1;
          }
          descr = pcVar6 + uVar2;
          pcVar5 = "identical data destination";
          if (local_40 != 0) {
            if ((local_40 & 1) != 0) {
              local_48._0_3_ = CONCAT12(local_3f,(undefined2)local_48);
            }
            if ((local_40 & 2) != 0) {
              local_48 = CONCAT13(local_3e,(undefined3)local_48);
            }
            if ((local_40 & 4) == 0) {
              cVar1 = (char)local_44;
            }
            else {
              local_44 = CONCAT11(local_44._1_1_,local_3d);
              cVar1 = local_3d;
            }
            pcVar5 = "illegal data destination";
            if (local_48._2_1_ != '\0') {
              pcVar5 = "illegal data destination";
              if ((local_48._3_1_ != '\0') && (pcVar5 = "illegal data destination", cVar1 != '\0'))
              goto LAB_001085fd;
            }
          }
          iVar3 = 0;
          mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s",pcVar5,(local_48 & 0xff) + 1,
                         pcVar6);
          uVar2 = mpt_string_dest(&local_40,0x3a,descr);
          pcVar6 = descr;
          if (uVar2 == 0) goto LAB_00108753;
        } while( true );
      }
      iVar3 = 0;
      goto LAB_00108753;
    }
    local_4a = 0x310c;
    iVar3 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
    if (iVar3 < 0) {
LAB_0010874a:
      iVar3 = -2;
    }
    else {
      sVar4 = (*out->_vptr->push)(out,2,&local_4a);
      iVar3 = (int)sVar4;
      if (-1 < (int)sVar4) {
        sVar4 = (*out->_vptr->push)(out,0,(void *)0x0);
        iVar3 = 0;
        if ((int)sVar4 < 0) {
          (*out->_vptr->push)(out,1,(void *)0x0);
          iVar3 = (int)sVar4;
        }
      }
    }
  }
  return iVar3;
LAB_001085fd:
  if ((char)local_4a != '\0') {
    iVar3 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
    if (iVar3 < 0) goto LAB_0010874a;
    sVar4 = (*out->_vptr->push)(out,2,&local_4a);
    if ((int)sVar4 < 0) {
      return (int)sVar4;
    }
    local_4a = local_4a & 0xff00;
  }
  local_48 = local_48 & 0xffffff00;
  local_44 = local_44 & 0xff;
  sVar4 = (*out->_vptr->push)(out,6,&local_48);
  if ((int)sVar4 < 0) goto LAB_00108764;
  local_48 = CONCAT31(local_48._1_3_,(char)local_38);
  local_44 = CONCAT11(1,(char)local_44);
  sVar4 = (*out->_vptr->push)(out,6,&local_48);
  if ((int)sVar4 < 0) goto LAB_00108764;
  local_40 = 3;
  iVar3 = (int)local_38;
  local_38 = (ulong)(iVar3 + 1);
  if (iVar3 == 0xff) {
    iVar3 = 0xff;
LAB_00108753:
    sVar4 = (*out->_vptr->push)(out,0,(void *)0x0);
    if (-1 < sVar4) {
      return iVar3;
    }
LAB_00108764:
    (*out->_vptr->push)(out,1,(void *)0x0);
    return -1;
  }
  goto LAB_0010853b;
}

Assistant:

extern int mpt_output_bind_string(MPT_INTERFACE(output) *out, const char *descr)
{
	MPT_STRUCT(strdest) str;
	MPT_STRUCT(msgtype) mt;
	struct {
		MPT_STRUCT(valsrc)  src;
		MPT_STRUCT(laydest) dst;
	} bnd;
	int len, dim = 1;
	
	if (!out) {
		return MPT_ERROR(BadArgument);
	}
	
	bnd.src.dim = 0;
	bnd.src.state = MPT_DATASTATE(All);
	
	bnd.dst.lay = bnd.dst.grf = bnd.dst.wld = 1;
	bnd.dst.dim = 0;
	
	str.change = 3;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(BindingAdd);
	
	if (!descr) {
		mt.arg = MPT_MESGGRF(BindingClear);
		if (out->_vptr->await(out, 0, 0) < 0) {
			return -2;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
			return len;
		}
		if ((len = out->_vptr->push(out, 0, 0)) < 0) {
			out->_vptr->push(out, 1, 0);
			return len;
		}
		return 0;
	}
	/* read binding description string */
	while ((len = mpt_string_dest(&str, ':', descr))) {
		if (len < 0) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                      MPT_tr("bad data destination"), bnd.src.dim+1, descr);
			return dim - 1;
		}
		descr += len;
		if (!str.change) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("identical data destination"), bnd.src.dim+1, descr-len);
			continue;
		}
		if (str.change & 1) bnd.dst.lay = str.val[0];
		if (str.change & 2) bnd.dst.grf = str.val[1];
		if (str.change & 4) bnd.dst.wld = str.val[2];
		
		if (!bnd.dst.lay || !bnd.dst.grf || !bnd.dst.wld) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("illegal data destination"), bnd.src.dim+1, descr - len);
			continue;
		}
		/* register/write header on first occasion */
		if (mt.cmd) {
			if (out->_vptr->await(out, 0, 0) < 0) {
				return -2;
			}
			if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
				return len;
			}
			mt.cmd = 0;
		}
		/* append x/y data bindings */
		bnd.src.dim = 0;
		bnd.dst.dim = 0;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		bnd.src.dim = dim;
		bnd.dst.dim = 1;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		
		str.change = 3;
		
		if ((len = dim++) == UINT8_MAX) break;
	}
	/* clear message data and registration */
	if (len < 0 || out->_vptr->push(out, 0, 0) < 0) {
		out->_vptr->push(out, 1, 0);
		return -1;
	}
	return len;
}